

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

bool test_uintwide_t_edge::test_various_isolated_edge_cases(void)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  representation_type rVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  value_type_conflict3 vVar10;
  value_type_conflict3 vVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  value_type_conflict3 vVar15;
  value_type_conflict3 vVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  value_type_conflict3 vVar19;
  value_type_conflict3 vVar20;
  value_type_conflict3 vVar21;
  value_type_conflict3 vVar22;
  value_type_conflict3 vVar23;
  enable_if_t<std::is_integral<int>::value,_bool> eVar24;
  uintwide_t<64U,_unsigned_short,_void,_false> *puVar25;
  unsigned_long __value;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short>_>
  *peVar26;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
  *peVar27;
  enable_if_t<(std::is_integral<unsigned_int>::value_&&_(_std::is_signed<unsigned_int>::value)),_uintwide_t<256U,_unsigned_short,_void,_true>_>
  *peVar28;
  char cVar29;
  char cVar30;
  uint uVar31;
  ulong uVar32;
  undefined2 *puVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  uint i;
  int iVar37;
  local_unsigned_conversion_type u;
  ulong uVar38;
  byte bVar39;
  byte bVar40;
  ulong in_R8;
  uint i_3;
  _Adaptor<std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>,_float>
  __aurng;
  value_type_conflict3 *this;
  ushort uVar41;
  uint i_2;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  float fVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  local_uint64_type c_uint;
  local_uint64_type a_uint;
  local_uint64_type b_uint;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  ur_ctrl;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> ul_neg;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  ul_ctrl;
  uintwide_t<256U,_unsigned_short,_void,_false> local_198;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  undefined1 local_168 [16];
  float local_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  ulong local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_dc;
  ulong local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b0;
  longdouble local_a4;
  
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_178;
  _local_178 = auVar9 << 0x40;
  uVar32 = 0xff00000004000000;
  lVar35 = 0;
  do {
    *(short *)(local_178 + lVar35) = (short)uVar32;
    if (uVar32 < 0x10000) break;
    uVar32 = uVar32 >> 0x10;
    bVar42 = lVar35 != 6;
    lVar35 = lVar35 + 2;
  } while (bVar42);
  uVar36 = 0x3000000000f;
  puVar33 = (undefined2 *)local_148;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_148._8_8_;
  local_148 = auVar5 << 0x40;
  uVar32 = 0x3000000000f;
  do {
    *puVar33 = (short)uVar32;
    puVar33 = puVar33 + 1;
    bVar42 = 0xffff < uVar32;
    uVar32 = uVar32 >> 0x10;
  } while (bVar42);
  local_148._6_2_ = 0;
  lVar35 = 6;
  do {
    bVar40 = 0;
    if (lVar35 == -2) break;
    puVar1 = (ushort *)(local_178 + lVar35);
    puVar2 = (ushort *)(local_148 + lVar35);
    bVar40 = -(*puVar1 <= *puVar2) | 1;
    lVar35 = lVar35 + -2;
    in_R8 = (ulong)bVar40;
  } while (*puVar1 == *puVar2);
  if (bVar40 == 0xff) {
    rVar6.super_array<unsigned_short,_4UL>.elems =
         (array<unsigned_short,_4UL>)(array<unsigned_short,_4UL>)local_178;
    local_178 = (undefined1  [8])local_148._0_8_;
    uVar32 = 0xff00000004000000;
  }
  else {
    uVar32 = 0x3000000000f;
    uVar36 = 0xff00000004000000;
    rVar6.super_array<unsigned_short,_4UL>.elems =
         (array<unsigned_short,_4UL>)(array<unsigned_short,_4UL>)local_148._0_8_;
  }
  local_148._0_8_ = rVar6.super_array<unsigned_short,_4UL>.elems;
  this = (value_type_conflict3 *)&local_198;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
  local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
  puVar25 = math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>::operator/=
                      ((uintwide_t<64U,_unsigned_short,_void,_false> *)this,
                       (uintwide_t<64U,_unsigned_short,_void,_false> *)local_148);
  uVar4 = *(undefined8 *)(puVar25->values).super_array<unsigned_short,_4UL>.elems;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = (value_type_conflict3)uVar4;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] =
       (value_type_conflict3)((ulong)uVar4 >> 0x10);
  local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84((ulong)uVar4 >> 0x20,0);
  lVar35 = 0;
  uVar38 = 0;
  do {
    uVar38 = uVar38 | (ulong)*this << ((byte)lVar35 & 0x3f);
    lVar35 = lVar35 + 0x10;
    this = this + 1;
  } while (lVar35 != 0x40);
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  uStack_170._0_4_ = 0xffffffff;
  local_178 = (undefined1  [8])0xffffffffffffffff;
  uStack_170._4_4_ = 0xffffffff;
  local_168._8_4_ = 0xffffffff;
  local_168._0_8_ = 0xffffffffffffffff;
  local_168._12_4_ = 0xffffffff;
  lVar35 = 0x1e;
  do {
    bVar40 = 0;
    if (lVar35 == -2) break;
    uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
    puVar1 = (ushort *)(local_178 + lVar35);
    bVar40 = -(uVar41 <= *puVar1) | 1;
    lVar35 = lVar35 + -2;
  } while (uVar41 == *puVar1);
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  auVar7._12_4_ = 0;
  auVar7._0_12_ = stack0xfffffffffffffe8c;
  _local_178 = auVar7 << 0x20;
  eVar24 = math::wide_integer::operator==(&local_198,(int *)local_178);
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  uStack_170._0_4_ = 0xffffffff;
  local_178 = (undefined1  [8])0xffffffffffffffff;
  uStack_170._4_4_ = 0xffffffff;
  local_168._8_4_ = 0xffffffff;
  local_168._0_8_ = 0xffffffffffffffff;
  local_168._12_4_ = 0xffffffff;
  lVar35 = 0x1e;
  do {
    bVar39 = 0;
    if (lVar35 == -2) break;
    uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
    puVar1 = (ushort *)(local_178 + lVar35);
    bVar39 = -(uVar41 <= *puVar1) | 1;
    lVar35 = lVar35 + -2;
  } while (uVar41 == *puVar1);
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  uStack_170._0_4_ = 0xffffffff;
  local_178 = (undefined1  [8])0xffffffffffffffff;
  uStack_170._4_4_ = 0xffffffff;
  local_168._8_4_ = 0xffffffff;
  local_168._0_8_ = 0xffffffffffffffff;
  local_168._12_4_ = 0xffffffff;
  lVar35 = 0x1e;
  uVar34 = 0;
  do {
    cVar29 = (char)uVar34;
    if (lVar35 == -2) break;
    uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
    uVar3 = *(ushort *)(local_178 + lVar35);
    lVar35 = lVar35 + -2;
    in_R8 = (ulong)(byte)(-(uVar41 <= uVar3) | 1);
    if (uVar41 != uVar3) {
      uVar34 = in_R8;
    }
    cVar29 = (char)uVar34;
  } while (uVar41 == uVar3);
  bVar42 = (eVar24 && (uVar36 / uVar32 == 0x54ffff && uVar38 == 0x54ffff)) &&
           ((bVar39 == 0 && bVar40 == 0) && cVar29 == '\0');
  iVar37 = 0x10;
  do {
    __value = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
    std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
              ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)eng_flt,__value);
    eng_flt._112_8_ = 0;
    fVar47 = std::
             generate_canonical<float,24ul,std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,48ul,5ul,12ul>,389ul,11ul>>
                       ((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                         *)eng_flt);
    local_14c = (fVar47 * 0.029999971 + 1.01) * INFINITY;
    fVar47 = std::
             generate_canonical<float,24ul,std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,48ul,5ul,12ul>,389ul,11ul>>
                       ((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                         *)eng_flt);
    local_b0 = (double)(fVar47 * 0.029999971 + 1.01) * INFINITY;
    fVar47 = std::
             generate_canonical<float,24ul,std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,48ul,5ul,12ul>,389ul,11ul>>
                       ((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                         *)eng_flt);
    local_dc = fVar47 * 0.029999971 + 1.01;
    local_a4 = (longdouble)local_dc * (longdouble)INFINITY;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<float,_nullptr>
              (&local_198,local_14c);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<double,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_178,local_b0);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<long_double,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,local_a4);
    auVar8._12_4_ = 0;
    auVar8._0_12_ = stack0xfffffffffffffedc;
    _local_128 = auVar8 << 0x20;
    eVar24 = math::wide_integer::operator==(&local_198,(int *)local_128);
    if (eVar24) {
      local_108 = local_108 & 0xffffffff00000000;
      eVar24 = math::wide_integer::operator==
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_178,
                          (int *)&local_108);
      if (!eVar24) goto LAB_00114ccd;
      local_d8 = local_d8 & 0xffffffff00000000;
      eVar24 = math::wide_integer::operator==
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,
                          (int *)&local_d8);
      bVar42 = (bool)(eVar24 & bVar42);
    }
    else {
LAB_00114ccd:
      bVar42 = false;
    }
    iVar37 = iVar37 + -1;
  } while (iVar37 != 0);
  iVar37 = 0;
  do {
    uVar41 = 0;
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_178,
               (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
    vVar15 = local_198.values.super_array<unsigned_short,_16UL>.elems[8];
    local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
    vVar16 = local_198.values.super_array<unsigned_short,_16UL>.elems[9];
    local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
    uVar17 = local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
    uVar18 = local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
    vVar19 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
    vVar20 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
    vVar10 = local_198.values.super_array<unsigned_short,_16UL>.elems[0];
    local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
    vVar11 = local_198.values.super_array<unsigned_short,_16UL>.elems[1];
    local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
    uVar12 = local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
    uVar13 = local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
    uVar14 = local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_;
    lVar35 = 0x1e;
    do {
      uVar3 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           uVar41 | uVar3 >> 4;
      uVar41 = uVar3 << 0xc;
      lVar35 = lVar35 + -2;
    } while (lVar35 != -2);
    local_138._12_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_138._8_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_138._10_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_138._14_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_138._0_8_ = local_168._0_8_;
    local_148 = _local_178;
    lVar35 = 0x1e;
    uVar41 = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar19;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar20;
    do {
      uVar3 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           uVar41 | uVar3 >> 4;
      uVar41 = uVar3 << 0xc;
      lVar35 = lVar35 + -2;
    } while (lVar35 != -2);
    local_118._12_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_118._8_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_118._10_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_118._14_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_118._0_8_ = local_168._0_8_;
    _local_128 = _local_178;
    uVar41 = 0;
    lVar35 = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar19;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar20;
    do {
      uVar3 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           uVar41 | uVar3 << 4;
      lVar35 = lVar35 + 2;
      uVar41 = uVar3 >> 0xc;
    } while (lVar35 != 0x20);
    local_f8 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_198.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_f0 = CONCAT26(local_198.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_198.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    local_108 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                         CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[1],
                                  local_198.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_100 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    uVar41 = 0;
    lVar35 = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0] = vVar10;
    local_198.values.super_array<unsigned_short,_16UL>.elems[1] = vVar11;
    local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = uVar12;
    local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = uVar13;
    local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = uVar14;
    local_198.values.super_array<unsigned_short,_16UL>.elems[8] = vVar15;
    local_198.values.super_array<unsigned_short,_16UL>.elems[9] = vVar16;
    local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = uVar17;
    local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = uVar18;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar19;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar20;
    do {
      uVar3 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           uVar41 | uVar3 << 4;
      lVar35 = lVar35 + 2;
      uVar41 = uVar3 >> 0xc;
    } while (lVar35 != 0x20);
    local_c8 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_198.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_c0 = CONCAT26(local_198.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_198.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    local_d8 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                        CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[1],
                                 local_198.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_d0 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                         local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    lVar35 = 0x1e;
    do {
      bVar40 = 0;
      if (lVar35 == -2) break;
      puVar1 = (ushort *)((long)&local_108 + lVar35);
      puVar2 = (ushort *)((long)&local_d8 + lVar35);
      bVar40 = -(*puVar1 <= *puVar2) | 1;
      lVar35 = lVar35 + -2;
    } while (*puVar1 == *puVar2);
    lVar35 = 0x1e;
    uVar32 = 0;
    do {
      cVar29 = (char)uVar32;
      if (lVar35 == -2) break;
      uVar41 = *(ushort *)(local_148 + lVar35);
      uVar3 = *(ushort *)(local_128 + lVar35);
      lVar35 = lVar35 + -2;
      in_R8 = (ulong)(byte)(-(uVar41 <= uVar3) | 1);
      if (uVar41 != uVar3) {
        uVar32 = in_R8;
      }
      cVar29 = (char)uVar32;
    } while (uVar41 == uVar3);
    bVar42 = (bool)(bVar42 & (bVar40 == 0 && cVar29 == '\0'));
    iVar37 = iVar37 + 1;
  } while (iVar37 != 0x100);
  iVar37 = 0;
  do {
    local_148 = _local_178;
    _local_128 = _local_178;
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_178,(test_uintwide_t_edge *)0x0
               ,false,0x4c,(int)in_R8);
    local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
    vVar15 = local_198.values.super_array<unsigned_short,_16UL>.elems[8];
    local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
    vVar16 = local_198.values.super_array<unsigned_short,_16UL>.elems[9];
    local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
    uVar17 = local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
    uVar18 = local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
    vVar19 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
    vVar20 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
    vVar10 = local_198.values.super_array<unsigned_short,_16UL>.elems[0];
    local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
    vVar11 = local_198.values.super_array<unsigned_short,_16UL>.elems[1];
    local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
    uVar12 = local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
    uVar13 = local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_;
    local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
    uVar14 = local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_;
    uVar31 = (uint)(int)(short)local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] >> 0xf
             & 0xf000;
    lVar35 = 0x1e;
    do {
      uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           (ushort)uVar31 | uVar41 >> 4;
      vVar21 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
      uVar31 = (uint)uVar41 << 0xc;
      lVar35 = lVar35 + -2;
    } while (lVar35 != -2);
    local_138._12_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_138._8_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_138._10_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_138._14_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_138._0_8_ = local_168._0_8_;
    local_148 = _local_178;
    uVar31 = (uint)(int)(short)vVar20 >> 0xf & 0xf000;
    lVar35 = 0x1e;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar19;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar20;
    do {
      uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           (ushort)uVar31 | uVar41 >> 4;
      vVar22 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
      uVar31 = (uint)uVar41 << 0xc;
      lVar35 = lVar35 + -2;
    } while (lVar35 != -2);
    local_118._12_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_118._8_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_118._10_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_118._14_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_118._0_8_ = local_168._0_8_;
    _local_128 = _local_178;
    uVar41 = 0;
    lVar35 = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar19;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar20;
    do {
      uVar3 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           uVar41 | uVar3 << 4;
      vVar23 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
      lVar35 = lVar35 + 2;
      uVar41 = uVar3 >> 0xc;
    } while (lVar35 != 0x20);
    local_f8 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_198.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_f0 = CONCAT26(local_198.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_198.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    local_108 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                         CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[1],
                                  local_198.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_100 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    uVar41 = 0;
    lVar35 = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0] = vVar10;
    local_198.values.super_array<unsigned_short,_16UL>.elems[1] = vVar11;
    local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = uVar12;
    local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = uVar13;
    local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = uVar14;
    local_198.values.super_array<unsigned_short,_16UL>.elems[8] = vVar15;
    local_198.values.super_array<unsigned_short,_16UL>.elems[9] = vVar16;
    local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = uVar17;
    local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = uVar18;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar19;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar20;
    do {
      uVar3 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35) =
           uVar41 | uVar3 << 4;
      lVar35 = lVar35 + 2;
      uVar41 = uVar3 >> 0xc;
    } while (lVar35 != 0x20);
    local_c8 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_198.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_c0 = CONCAT26(local_198.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_198.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    local_d8 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                        CONCAT22(local_198.values.super_array<unsigned_short,_16UL>.elems[1],
                                 local_198.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_d0 = CONCAT44(local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                         local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    if ((short)(vVar23 ^ local_198.values.super_array<unsigned_short,_16UL>.elems[0xf]) < 0) {
      bVar43 = false;
    }
    else {
      lVar35 = 0x1e;
      do {
        bVar40 = 0;
        if (lVar35 == -2) break;
        puVar1 = (ushort *)((long)&local_108 + lVar35);
        puVar2 = (ushort *)((long)&local_d8 + lVar35);
        bVar40 = -(*puVar1 <= *puVar2) | 1;
        lVar35 = lVar35 + -2;
      } while (*puVar1 == *puVar2);
      bVar43 = bVar40 == 0;
    }
    if ((short)(vVar21 ^ vVar22) < 0) {
      bVar40 = 0;
    }
    else {
      lVar35 = 0x1e;
      do {
        bVar40 = 0;
        if (lVar35 == -2) break;
        puVar1 = (ushort *)(local_148 + lVar35);
        puVar2 = (ushort *)(local_128 + lVar35);
        bVar40 = -(*puVar1 <= *puVar2) | 1;
        lVar35 = lVar35 + -2;
      } while (*puVar1 == *puVar2);
      bVar40 = bVar40 == 0 & bVar42;
    }
    bVar42 = (bool)(bVar43 & bVar40);
    iVar37 = iVar37 + 1;
  } while (iVar37 != 0x100);
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 1;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_168 = (undefined1  [16])0x0;
  _local_178 = (undefined1  [16])0x0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            (&local_198,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_178);
  uStack_170._0_4_ = 0xffffffff;
  local_178 = (undefined1  [8])0xffffffffffffffff;
  uStack_170._4_4_ = 0xffffffff;
  local_168._8_4_ = 0xffffffff;
  local_168._0_8_ = 0xffffffffffffffff;
  local_168._12_4_ = 0xffffffff;
  lVar35 = 0x1e;
  do {
    bVar40 = 0;
    if (lVar35 == -2) break;
    uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
    puVar1 = (ushort *)(local_178 + lVar35);
    bVar40 = -(uVar41 <= *puVar1) | 1;
    lVar35 = lVar35 + -2;
  } while (uVar41 == *puVar1);
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 1;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_168 = (undefined1  [16])0x0;
  _local_178 = (undefined1  [16])0x0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            (&local_198,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_178);
  uStack_170._0_4_ = 0xffffffff;
  local_178 = (undefined1  [8])0xffffffffffffffff;
  uStack_170._4_4_ = 0xffffffff;
  local_168._8_4_ = 0xffffffff;
  local_168._0_8_ = 0xffffffffffffffff;
  local_168._12_4_ = 0xffffffff;
  lVar35 = 0x1e;
  do {
    bVar39 = 0;
    if (lVar35 == -2) break;
    uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
    puVar1 = (ushort *)(local_178 + lVar35);
    bVar39 = -(uVar41 <= *puVar1) | 1;
    lVar35 = lVar35 + -2;
  } while (uVar41 == *puVar1);
  bVar40 = (bVar39 == 0 && bVar40 == 0) & bVar42;
  iVar37 = 0;
  do {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&local_198,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
              (&local_198,&zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
    uStack_170._0_4_ = 0xffffffff;
    local_178 = (undefined1  [8])0xffffffffffffffff;
    uStack_170._4_4_ = 0xffffffff;
    local_168._8_4_ = 0xffffffff;
    local_168._0_8_ = 0xffffffffffffffff;
    local_168._12_4_ = 0xffffffff;
    lVar35 = 0x1e;
    do {
      bVar39 = 0;
      if (lVar35 == -2) break;
      uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      puVar1 = (ushort *)(local_178 + lVar35);
      bVar39 = -(uVar41 <= *puVar1) | 1;
      lVar35 = lVar35 + -2;
    } while (uVar41 == *puVar1);
    bVar40 = bVar40 & bVar39 == 0;
    iVar37 = iVar37 + 1;
  } while (iVar37 != 0x100);
  iVar37 = 0;
  do {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&local_198,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    local_178._2_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[1];
    local_178._0_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0];
    local_178._4_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[2];
    local_178._6_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[3];
    uStack_170._4_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[6];
    uStack_170._6_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[7];
    uStack_170._0_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[4];
    uStack_170._2_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[5];
    local_168._2_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[9];
    local_168._0_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[8];
    local_168._4_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[10];
    local_168._6_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xb];
    local_168._12_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_168._8_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_168._10_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_168._14_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_138 = (undefined1  [16])0x0;
    local_148 = (undefined1  [16])0x0;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator/=
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_178,
               (uintwide_t<256U,_unsigned_short,_void,_true> *)local_148);
    local_138._8_4_ = 0xffffffff;
    local_138._0_8_ = 0xffffffffffffffff;
    local_138._12_4_ = 0xffffffff;
    local_148._8_4_ = 0xffffffff;
    local_148._0_8_ = 0xffffffffffffffff;
    local_148._12_4_ = 0xffffffff;
    local_138._14_2_ = 0x7fff;
    if ((short)(local_168._14_2_ ^ 0x7fff) < 0) {
      bVar40 = 0;
    }
    else {
      lVar35 = 0x1e;
      do {
        bVar39 = 0;
        if (lVar35 == -2) break;
        puVar1 = (ushort *)(local_178 + lVar35);
        puVar2 = (ushort *)(local_148 + lVar35);
        bVar39 = -(*puVar1 <= *puVar2) | 1;
        lVar35 = lVar35 + -2;
      } while (*puVar1 == *puVar2);
      bVar40 = bVar40 & bVar39 == 0;
    }
    iVar37 = iVar37 + 1;
  } while (iVar37 != 0x100);
  local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            (&local_198,&zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
  uStack_170._0_4_ = 0xffffffff;
  local_178 = (undefined1  [8])0xffffffffffffffff;
  uStack_170._4_4_ = 0xffffffff;
  local_168._8_4_ = 0xffffffff;
  local_168._0_8_ = 0xffffffffffffffff;
  local_168._12_4_ = 0xffffffff;
  lVar35 = 0x1e;
  do {
    bVar39 = 0;
    if (lVar35 == -2) break;
    uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
    puVar1 = (ushort *)(local_178 + lVar35);
    bVar39 = -(uVar41 <= *puVar1) | 1;
    lVar35 = lVar35 + -2;
  } while (uVar41 == *puVar1);
  bVar40 = bVar39 == 0 & bVar40;
  iVar37 = 0;
  do {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,
               (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    local_168 = (undefined1  [16])0x0;
    _local_178 = (undefined1  [16])0x0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
    local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::eval_divide_knuth
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_178,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,&local_198);
    local_178._2_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[1];
    local_178._0_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[0];
    local_178._4_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[2];
    local_178._6_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[3];
    uStack_170._4_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[6];
    uStack_170._6_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[7];
    uStack_170._0_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[4];
    uStack_170._2_2_ = local_198.values.super_array<unsigned_short,_16UL>.elems[5];
    lVar35 = 0x1e;
    do {
      bVar39 = 0;
      if (lVar35 == -2) break;
      uVar41 = *(ushort *)((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
      uVar3 = *(ushort *)
               ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values.
                      super_array<unsigned_short,_16UL>.elems + lVar35);
      bVar39 = -(uVar41 <= uVar3) | 1;
      lVar35 = lVar35 + -2;
    } while (uVar41 == uVar3);
    bVar40 = bVar40 & bVar39 == 0;
    iVar37 = iVar37 + 1;
    if (iVar37 == 0x100) {
      local_168 = (undefined1  [16])0x0;
      _local_178 = (undefined1  [16])0x0;
      bVar42 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::rd_string
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_178,
                          "10000000000000000000000000000000000000000",0xffffffffffffffff,0);
      if (!bVar42) {
        local_168._8_4_ = 0xffffffff;
        local_168._0_8_ = 0xffffffffffffffff;
        local_168._12_4_ = 0xffffffff;
        uStack_170._0_4_ = 0xffffffff;
        local_178 = (undefined1  [8])0xffffffffffffffff;
        uStack_170._4_4_ = 0xffffffff;
      }
      auVar9 = _local_178;
      local_138._0_8_ = local_168._0_8_;
      local_138._8_8_ = local_168._8_8_;
      local_148._0_8_ = local_178;
      local_148._8_2_ = (value_type_conflict3)uStack_170;
      local_148._10_2_ = uStack_170._2_2_;
      local_148._12_2_ = uStack_170._4_2_;
      local_148._14_2_ = uStack_170._6_2_;
      local_118 = (undefined1  [16])0x0;
      _local_128 = (undefined1  [16])0x0;
      _local_178 = auVar9;
      bVar42 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::rd_string
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_128,
                          "10000000000000000000000000000000000000000",0xffffffffffffffff,0);
      if (!bVar42) {
        local_118._8_4_ = 0xffffffff;
        local_118._0_8_ = 0xffffffffffffffff;
        local_118._12_4_ = 0xffffffff;
        uStack_120 = 0xffffffff;
        local_128 = (undefined1  [8])0xffffffffffffffff;
        uStack_11c = 0xffffffff;
      }
      local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::eval_divide_knuth
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)local_128,&local_198);
      local_148 = ZEXT816(0);
      local_138 = ZEXT816(0);
      local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
      local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
      eVar24 = math::wide_integer::operator==
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,
                          (int *)&local_198);
      bVar42 = false;
      if (eVar24) {
        local_108 = local_108 & 0xffffffff00000000;
        eVar24 = math::wide_integer::operator==
                           ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_148,
                            (int *)&local_108);
        bVar42 = (bool)(eVar24 & bVar40);
      }
      local_14c = 0.0;
      do {
        uVar31 = 300;
        do {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_178,
                     (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
          peVar26 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator<<=
                              ((uintwide_t<256u,unsigned_short,void,false> *)&local_198,uVar31);
          local_148 = *(undefined1 (*) [16])
                       (peVar26->values).super_array<unsigned_short,_16UL>.elems;
          local_138 = *(undefined1 (*) [16])
                       ((peVar26->values).super_array<unsigned_short,_16UL>.elems + 8);
          _local_128 = ZEXT816(0);
          local_118 = ZEXT816(0);
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
          peVar26 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator>>=
                              ((uintwide_t<256u,unsigned_short,void,false> *)&local_198,uVar31);
          local_108 = *(ulong *)(peVar26->values).super_array<unsigned_short,_16UL>.elems;
          uStack_100 = *(undefined8 *)
                        ((peVar26->values).super_array<unsigned_short,_16UL>.elems + 4);
          local_f8 = *(undefined8 *)((peVar26->values).super_array<unsigned_short,_16UL>.elems + 8);
          uStack_f0 = *(undefined8 *)
                       ((peVar26->values).super_array<unsigned_short,_16UL>.elems + 0xc);
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
          lVar35 = 0x1e;
          do {
            bVar40 = 0;
            if (lVar35 == -2) break;
            puVar1 = (ushort *)(local_148 + lVar35);
            uVar41 = *(ushort *)
                      ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values.
                             super_array<unsigned_short,_16UL>.elems + lVar35);
            bVar40 = -(*puVar1 <= uVar41) | 1;
            lVar35 = lVar35 + -2;
          } while (*puVar1 == uVar41);
          lVar35 = 0x1e;
          do {
            bVar39 = 0;
            if (lVar35 == -2) break;
            puVar1 = (ushort *)(local_128 + lVar35);
            uVar41 = *(ushort *)
                      ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values.
                             super_array<unsigned_short,_16UL>.elems + lVar35);
            bVar39 = -(*puVar1 <= uVar41) | 1;
            lVar35 = lVar35 + -2;
          } while (*puVar1 == uVar41);
          lVar35 = 0x1e;
          uVar32 = 0;
          do {
            cVar29 = (char)uVar32;
            if (lVar35 == -2) break;
            uVar41 = *(ushort *)((long)&local_108 + lVar35);
            uVar3 = *(ushort *)
                     ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values.
                            super_array<unsigned_short,_16UL>.elems + lVar35);
            lVar35 = lVar35 + -2;
            in_R8 = (ulong)(byte)(-(uVar41 <= uVar3) | 1);
            if (uVar41 != uVar3) {
              uVar32 = in_R8;
            }
            cVar29 = (char)uVar32;
          } while (uVar41 == uVar3);
          lVar35 = 0x1e;
          uVar32 = 0;
          do {
            cVar30 = (char)uVar32;
            if (lVar35 == -2) break;
            uVar41 = *(ushort *)
                      ((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
            uVar3 = *(ushort *)
                     ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values.
                            super_array<unsigned_short,_16UL>.elems + lVar35);
            lVar35 = lVar35 + -2;
            in_R8 = (ulong)(byte)(-(uVar41 <= uVar3) | 1);
            if (uVar41 != uVar3) {
              uVar32 = in_R8;
            }
            cVar30 = (char)uVar32;
          } while (uVar41 == uVar3);
          if (((bVar39 != 0 || bVar40 != 0) || cVar29 != '\0') || cVar30 != '\0') {
            bVar42 = false;
          }
          bVar43 = uVar31 < 0x76c;
          uVar31 = uVar31 + 100;
        } while (bVar43);
        local_14c = (float)((int)local_14c + 1);
      } while (local_14c != 3.58732e-43);
      local_14c = 0.0;
      do {
        uVar31 = 300;
        do {
          bVar43 = false;
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                    ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_178,
                     (test_uintwide_t_edge *)0x0,false,0x4c,(int)in_R8);
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
          eVar24 = math::wide_integer::operator<
                             ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_178,
                              (int *)&local_198);
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
          peVar27 = math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator<<=
                              ((uintwide_t<256u,unsigned_short,void,true> *)&local_198,uVar31);
          local_148 = *(undefined1 (*) [16])
                       (peVar27->values).super_array<unsigned_short,_16UL>.elems;
          local_138 = *(undefined1 (*) [16])
                       ((peVar27->values).super_array<unsigned_short,_16UL>.elems + 8);
          _local_128 = ZEXT816(0);
          local_118 = ZEXT816(0);
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
          peVar27 = math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
                              ((uintwide_t<256u,unsigned_short,void,true> *)&local_198,uVar31);
          local_108 = *(ulong *)(peVar27->values).super_array<unsigned_short,_16UL>.elems;
          uStack_100 = *(undefined8 *)
                        ((peVar27->values).super_array<unsigned_short,_16UL>.elems + 4);
          local_f8 = *(undefined8 *)((peVar27->values).super_array<unsigned_short,_16UL>.elems + 8);
          uStack_f0 = *(undefined8 *)
                       ((peVar27->values).super_array<unsigned_short,_16UL>.elems + 0xc);
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = local_168._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = local_168._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_168._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_168._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_168._12_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_168._14_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = local_178._0_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = local_178._2_2_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_178._4_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_178._8_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_178._12_4_;
          peVar28 = math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
                              ((uintwide_t<256u,unsigned_short,void,true> *)&local_198,uVar31);
          uStack_c0 = *(undefined8 *)
                       ((peVar28->values).super_array<unsigned_short,_16UL>.elems + 0xc);
          local_d8 = *(ulong *)(peVar28->values).super_array<unsigned_short,_16UL>.elems;
          uStack_d0 = *(undefined8 *)((peVar28->values).super_array<unsigned_short,_16UL>.elems + 4)
          ;
          local_c8 = *(undefined8 *)((peVar28->values).super_array<unsigned_short,_16UL>.elems + 8);
          uVar4 = uStack_c0;
          if (-1 < (short)local_138._14_2_) {
            lVar35 = 0x1e;
            do {
              bVar40 = 0;
              if (lVar35 == -2) break;
              puVar1 = (ushort *)(local_148 + lVar35);
              uVar41 = *(ushort *)
                        ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values
                               .super_array<unsigned_short,_16UL>.elems + lVar35);
              bVar40 = -(*puVar1 <= uVar41) | 1;
              lVar35 = lVar35 + -2;
            } while (*puVar1 == uVar41);
            bVar43 = bVar40 == 0;
          }
          if ((short)local_118._14_2_ < 0) {
            bVar44 = false;
          }
          else {
            lVar35 = 0x1e;
            do {
              bVar40 = 0;
              if (lVar35 == -2) break;
              puVar1 = (ushort *)(local_128 + lVar35);
              uVar41 = *(ushort *)
                        ((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values
                               .super_array<unsigned_short,_16UL>.elems + lVar35);
              bVar40 = -(*puVar1 <= uVar41) | 1;
              lVar35 = lVar35 + -2;
            } while (*puVar1 == uVar41);
            bVar44 = bVar40 == 0;
          }
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] =
               local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems
               [8];
          vVar10 = local_198.values.super_array<unsigned_short,_16UL>.elems[8];
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] =
               local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems
               [9];
          vVar11 = local_198.values.super_array<unsigned_short,_16UL>.elems[9];
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ =
               local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems.
               _20_4_;
          uVar12 = local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] =
               local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems
               [0xe];
          vVar15 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xe];
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] =
               local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems
               [0xf];
          vVar16 = local_198.values.super_array<unsigned_short,_16UL>.elems[0xf];
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
               local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems.
               _24_4_;
          uVar13 = local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_;
          uVar48 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems._0_8_;
          uVar50 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems._8_8_;
          if (!eVar24) {
            uVar48._0_2_ = 0;
            uVar48._2_2_ = 0;
            uVar48._4_2_ = 0;
            uVar48._6_2_ = 0;
            uVar50._0_2_ = 0;
            uVar50._2_2_ = 0;
            uVar50._4_2_ = 0;
            uVar50._6_2_ = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
          }
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = (value_type_conflict3)uVar48
          ;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = SUB82(uVar48,2);
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84(uVar48,4);
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = SUB84(uVar50,0);
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = SUB84(uVar50,4);
          if ((short)(uStack_f0._6_2_ ^
                     local_198.values.super_array<unsigned_short,_16UL>.elems[0xf]) < 0) {
            bVar45 = false;
          }
          else {
            lVar35 = 0x1e;
            uVar32 = 0;
            do {
              cVar29 = (char)uVar32;
              if (lVar35 == -2) break;
              uVar41 = *(ushort *)((long)&local_108 + lVar35);
              uVar3 = *(ushort *)
                       ((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
              lVar35 = lVar35 + -2;
              in_R8 = (ulong)(byte)(-(uVar41 <= uVar3) | 1);
              if (uVar41 != uVar3) {
                uVar32 = in_R8;
              }
              cVar29 = (char)uVar32;
            } while (uVar41 == uVar3);
            bVar45 = cVar29 == '\0';
          }
          uVar49 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems._0_8_;
          uVar51 = local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.
                   elems._8_8_;
          local_198.values.super_array<unsigned_short,_16UL>.elems[8] = vVar10;
          local_198.values.super_array<unsigned_short,_16UL>.elems[9] = vVar11;
          local_198.values.super_array<unsigned_short,_16UL>.elems._20_4_ = uVar12;
          local_198.values.super_array<unsigned_short,_16UL>.elems._24_4_ = uVar13;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar15;
          local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar16;
          if (!eVar24) {
            uVar49._0_2_ = 0;
            uVar49._2_2_ = 0;
            uVar49._4_2_ = 0;
            uVar49._6_2_ = 0;
            uVar51._0_2_ = 0;
            uVar51._2_2_ = 0;
            uVar51._4_2_ = 0;
            uVar51._6_2_ = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            local_198.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
          }
          local_198.values.super_array<unsigned_short,_16UL>.elems[0] = (value_type_conflict3)uVar49
          ;
          local_198.values.super_array<unsigned_short,_16UL>.elems[1] = SUB82(uVar49,2);
          local_198.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84(uVar49,4);
          local_198.values.super_array<unsigned_short,_16UL>.elems._8_4_ = SUB84(uVar51,0);
          local_198.values.super_array<unsigned_short,_16UL>.elems._12_4_ = SUB84(uVar51,4);
          uStack_c0._6_2_ = (ushort)((ulong)uStack_c0 >> 0x30);
          if ((short)(uStack_c0._6_2_ ^
                     local_198.values.super_array<unsigned_short,_16UL>.elems[0xf]) < 0) {
            bVar46 = false;
          }
          else {
            lVar35 = 0x1e;
            do {
              bVar40 = 0;
              if (lVar35 == -2) break;
              puVar1 = (ushort *)((long)&local_d8 + lVar35);
              uVar41 = *(ushort *)
                        ((long)local_198.values.super_array<unsigned_short,_16UL>.elems + lVar35);
              in_R8 = (ulong)uVar41;
              bVar40 = -(*puVar1 <= uVar41) | 1;
              lVar35 = lVar35 + -2;
            } while (*puVar1 == uVar41);
            bVar46 = bVar40 == 0;
          }
          if (!bVar46) {
            bVar42 = false;
          }
          if (!(bool)(bVar43 & bVar44 & bVar45)) {
            bVar42 = false;
          }
          bVar43 = uVar31 < 0x76c;
          uVar31 = uVar31 + 100;
          uStack_c0 = uVar4;
        } while (bVar43);
        local_14c = (float)((int)local_14c + 1);
        if (local_14c == 3.58732e-43) {
          return bVar42;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

auto test_various_isolated_edge_cases() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  auto result_is_ok = true;

  {
    // See also bug report in legacy project long_long_long
    // https://github.com/ckormanyos/long_long_long/issues/11

    using local_uint64_type = local_uintwide_t_tiny_unsigned_type;
    using local_ctrl64_type = std::uint64_t;

    constexpr std::size_t
      max_size
      {
        static_cast<std::size_t>
        (
          std::numeric_limits<local_uint64_type>::digits / 8
        )
      };

    std::array<std::uint8_t, std::size_t { UINT8_C(16) }>
      buffer
      {
        0x00U, 0x00U, 0x00U, 0x04U, 0x00U, 0x00U, 0x00U, 0xFFU, // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        0x0FU, 0x00U, 0x00U, 0x00U, 0x00U, 0x03U, 0x00U, 0x00U  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    local_uint64_type a_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_uint64_type b_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    local_ctrl64_type a_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_ctrl64_type b_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    if(a_uint < b_uint)
    {
      std::swap(a_uint, b_uint);
      std::swap(a_ctrl, b_ctrl);
    }

    const local_uint64_type c_uint = a_uint / b_uint;
    const local_ctrl64_type c_ctrl = a_ctrl / b_ctrl;

    const bool
      result_op_is_ok
      {
           (static_cast<std::uint64_t>(c_uint) == c_ctrl)
        && (UINT64_C(0x000000000054FFFF) == c_ctrl)
      };

    result_is_ok = (result_op_is_ok && result_is_ok);
  }

  {
    using local_rep_type   = typename local_uintwide_t_small_unsigned_type::representation_type;
    using local_value_type = typename local_rep_type::value_type;

    local_rep_type
      rep
      (
        local_uintwide_t_small_unsigned_type::number_of_limbs,
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), static_cast<local_value_type>(UINT8_C(0)));

    const auto rep_as_zero_is_ok = (local_uintwide_t_small_unsigned_type(rep) == 0);

    result_is_ok = (rep_as_zero_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), (std::numeric_limits<local_value_type>::max)());

    const auto rep_as_max2_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max2_is_ok && result_is_ok);

    rep =
      local_rep_type
      (
        static_cast<typename local_rep_type::size_type>(rep.size()), // NOLINT(readability-static-accessed-through-instance)
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max3_is_ok =
    (
      local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (rep_as_max3_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(16));
           ++i)
  {
    eng_flt.seed(util::util_pseudorandom_time_point_seed::value<typename eng_flt_type::result_type>());

    auto dis =
      std::uniform_real_distribution<float>
      {
        static_cast<float>(1.01F), // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        static_cast<float>(1.04F)  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    const auto inf_f  = ::local_inf_f () * dis(eng_flt);
    const auto inf_d  = ::local_inf_d () * static_cast<double>(dis(eng_flt));
    const auto inf_ld = ::local_inf_ld() * static_cast<long double>(dis(eng_flt));

    local_uintwide_t_small_unsigned_type u_inf_f (inf_f);
    local_uintwide_t_small_unsigned_type u_inf_d (inf_d);
    local_uintwide_t_small_unsigned_type u_inf_ld(inf_ld);

    const auto result_infinities_is_ok = (   (u_inf_f  == 0)
                                          && (u_inf_d  == 0)
                                          && (u_inf_ld == 0));

    result_is_ok = (result_infinities_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of an unsigned wide-integer by a signed amount.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto ur_neg  = u_gen << static_cast<int>(INT8_C(-4));
    const auto ur_ctrl = u_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto ul_neg  = u_gen >> static_cast<int>(INT8_C(-4));
    const auto ul_ctrl = u_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (ul_neg == ul_ctrl);
    const auto result_right_is_ok = (ur_neg == ur_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of a signed wide-integer by a signed amount.

    const auto s_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

    const auto sr_neg  = s_gen << static_cast<int>(INT8_C(-4));
    const auto sr_ctrl = s_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto sl_neg  = s_gen >> static_cast<int>(INT8_C(-4));
    const auto sl_ctrl = s_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (sl_neg == sl_ctrl);
    const auto result_right_is_ok = (sr_neg == sr_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= zero_as_limb();

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= local_uintwide_t_small_unsigned_type(zero_as_limb());

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, unsigned numerator by zero which returns the maximum of the type.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    u_gen /= zero_as_small_unsigned_type();

    const auto result_unsigned_div_by_zero_is_ok = (u_gen == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_unsigned_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, signed numerator by zero which returns the maximum of the type.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
    auto n_gen = local_uintwide_t_small_signed_type(u_gen);

    n_gen /= local_uintwide_t_small_signed_type(zero_as_small_unsigned_type());

    const auto result_signed_div_by_zero_is_ok = (n_gen == (std::numeric_limits<local_uintwide_t_small_signed_type>::max)());

    result_is_ok = (result_signed_div_by_zero_is_ok && result_is_ok);
  }

  {
    // Verify division of zero by zero which returns the maximum of the type.

    auto z = zero_as_small_unsigned_type();

    z /= zero_as_small_unsigned_type();

    const auto result_zero_div_by_zero_is_ok = (z == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_zero_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify modulus of zero with a finite denominator which returns zero modulus.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto mod = zero_as_small_unsigned_type() % u_gen;

    const auto result_zero_mod_with_finite_is_ok = (mod == zero_as_small_unsigned_type());

    result_is_ok = (result_zero_mod_with_finite_is_ok && result_is_ok);
  }

  {
    const auto ten_pow_forty = local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000");

          auto a(ten_pow_forty);
    const auto b(local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000"));

    const auto& c(a %= b);

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    const auto& d(a %= a); // NOLINT(clang-diagnostic-self-assign-overloaded)

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    const auto result_self_mod_is_ok = ((c == 0) && (d == 0));

    result_is_ok = (result_self_mod_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount = // NOLINT(altera-id-dependent-backward-branch)
      static_cast<unsigned>
      (
          static_cast<int>
          (
                (std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(INT8_C(100)))
            + (((std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(INT8_C(100))) != 0) ? 1 : 0)
          )
        *
          static_cast<int>(INT8_C(100))
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      auto result_overshift_is_ok = true;

      const auto u_left_n  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::int32_t> (shift_amount);
      const auto u_left_u  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto u_right_n = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto u_right_u = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::uint32_t>(shift_amount);

      result_overshift_is_ok = ((u_left_n  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_left_u  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_n == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_u == zero_as_small_unsigned_type()) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount =
      static_cast<unsigned>
      (
          (
                (std::numeric_limits<local_uintwide_t_small_signed_type>::digits / 100)                // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
            + (((std::numeric_limits<local_uintwide_t_small_signed_type>::digits % 100) != 0) ? 1 : 0) // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
          )
        *
          100 // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto n_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

      const auto n_is_neg = (n_gen < 0);

      const auto n_left_n  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::int32_t> (shift_amount);
      const auto n_left_u  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto n_right_n = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto n_right_u = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::uint32_t>(shift_amount);

      auto result_overshift_is_ok = true;

      result_overshift_is_ok = ((n_left_n  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_left_u  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_n == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_u == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}